

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall DLevelScript::Unlink(DLevelScript *this)

{
  DLevelScript *pDVar1;
  DLevelScript *pDVar2;
  anon_union_8_2_947301c2_for_TObjPtr<DACSThinker>_1 pointing;
  
  if (DACSThinker::ActiveThinker.field_0 != (DACSThinker *)0x0) {
    pointing = DACSThinker::ActiveThinker.field_0;
    if ((*(byte *)((long)DACSThinker::ActiveThinker.field_0 + 0x20) & 0x20) == 0) goto LAB_003bc9a2;
    DACSThinker::ActiveThinker.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DACSThinker>_1)0x0;
  }
  pointing.p = (DACSThinker *)0x0;
LAB_003bc9a2:
  if ((pointing.p)->LastScript == this) {
    pDVar1 = this->prev;
    (pointing.p)->LastScript = pDVar1;
    if (((pDVar1 != (DLevelScript *)0x0) && (((pDVar1->super_DObject).ObjectFlags & 3) != 0)) &&
       ((((pointing.p)->super_DThinker).super_DObject.ObjectFlags & 4) != 0)) {
      GC::Barrier(pointing.o,&pDVar1->super_DObject);
    }
  }
  if ((pointing.p)->Scripts == this) {
    pDVar1 = this->next;
    (pointing.p)->Scripts = pDVar1;
    if (((pDVar1 != (DLevelScript *)0x0) && (((pDVar1->super_DObject).ObjectFlags & 3) != 0)) &&
       ((((pointing.p)->super_DThinker).super_DObject.ObjectFlags & 4) != 0)) {
      GC::Barrier(pointing.o,&pDVar1->super_DObject);
    }
  }
  pDVar1 = this->prev;
  if (pDVar1 != (DLevelScript *)0x0) {
    pDVar2 = this->next;
    pDVar1->next = pDVar2;
    if (((pDVar2 != (DLevelScript *)0x0) && (((pDVar2->super_DObject).ObjectFlags & 3) != 0)) &&
       (((pDVar1->super_DObject).ObjectFlags & 4) != 0)) {
      GC::Barrier(&pDVar1->super_DObject,&pDVar2->super_DObject);
    }
  }
  pDVar1 = this->next;
  if (pDVar1 != (DLevelScript *)0x0) {
    pDVar2 = this->prev;
    pDVar1->prev = pDVar2;
    if (((pDVar2 != (DLevelScript *)0x0) && (((pDVar2->super_DObject).ObjectFlags & 3) != 0)) &&
       (((pDVar1->super_DObject).ObjectFlags & 4) != 0)) {
      GC::Barrier(&pDVar1->super_DObject,&pDVar2->super_DObject);
      return;
    }
  }
  return;
}

Assistant:

void DLevelScript::Unlink ()
{
	DACSThinker *controller = DACSThinker::ActiveThinker;

	if (controller->LastScript == this)
	{
		controller->LastScript = prev;
		GC::WriteBarrier(controller, prev);
	}
	if (controller->Scripts == this)
	{
		controller->Scripts = next;
		GC::WriteBarrier(controller, next);
	}
	if (prev)
	{
		prev->next = next;
		GC::WriteBarrier(prev, next);
	}
	if (next)
	{
		next->prev = prev;
		GC::WriteBarrier(next, prev);
	}
}